

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O0

void annEnclCube(ANNpointArray pa,ANNidxArray pidx,int n,int dim,ANNorthRect *bnds)

{
  int in_ECX;
  int in_EDX;
  ANNidxArray in_RSI;
  ANNpointArray in_RDI;
  ANNorthRect *in_R8;
  double dVar1;
  ANNcoord half_diff;
  ANNcoord len_1;
  ANNcoord len;
  ANNcoord max_len;
  int d;
  double local_30;
  int local_24;
  
  annEnclRect(in_RDI,in_RSI,in_EDX,in_ECX,in_R8);
  local_30 = 0.0;
  for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
    dVar1 = in_R8->hi[local_24] - in_R8->lo[local_24];
    if (local_30 < dVar1) {
      local_30 = dVar1;
    }
  }
  for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
    dVar1 = (local_30 - (in_R8->hi[local_24] - in_R8->lo[local_24])) / 2.0;
    in_R8->lo[local_24] = in_R8->lo[local_24] - dVar1;
    in_R8->hi[local_24] = dVar1 + in_R8->hi[local_24];
  }
  return;
}

Assistant:

void annEnclCube(       // compute smallest enclosing cube
    ANNpointArray pa,   // point array
    ANNidxArray pidx,   // point indices
    int n,              // number of points
    int dim,            // dimension
    ANNorthRect &bnds)  // bounding cube (returned)
{
    int d;
    // compute smallest enclosing rect
    annEnclRect(pa, pidx, n, dim, bnds);

    ANNcoord max_len = 0;        // max length of any side
    for (d = 0; d < dim; d++) {  // determine max side length
        ANNcoord len = bnds.hi[d] - bnds.lo[d];
        if (len > max_len) {  // update max_len if longest
            max_len = len;
        }
    }
    for (d = 0; d < dim; d++) {  // grow sides to match max
        ANNcoord len = bnds.hi[d] - bnds.lo[d];
        ANNcoord half_diff = (max_len - len) / 2;
        bnds.lo[d] -= half_diff;
        bnds.hi[d] += half_diff;
    }
}